

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_to_compressed_c.cpp
# Opt level: O0

stb_uint stb_compress(stb_uchar *out,stb_uchar *input,stb_uint length)

{
  stb_uint length_local;
  stb_uchar *input_local;
  stb_uchar *out_local;
  
  stb__outfile = (FILE *)0x0;
  stb__out = out;
  stb_compress_inner(input,length);
  return (int)stb__out - (int)out;
}

Assistant:

stb_uint stb_compress(stb_uchar *out, stb_uchar *input, stb_uint length)
{
    stb__out = out;
    stb__outfile = NULL;

    stb_compress_inner(input, length);

    return stb__out - out;
}